

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeStringConst
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,string_view str)

{
  uint pos_00;
  bool bVar1;
  ulong pos_01;
  string_view str_00;
  string local_288;
  string_view local_268;
  Result<wasm::Ok> local_258;
  undefined4 local_230;
  allocator<char> local_229;
  string local_228;
  Err local_208;
  ParseDefsCtx *local_1d8;
  size_t sStack_1d0;
  stringstream local_1c0 [8];
  stringstream wtf16;
  String local_1b0 [376];
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_38;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_28;
  Index pos_local;
  ParseDefsCtx *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (ParseDefsCtx *)str._M_len;
  local_38 = annotations;
  annotations_local._4_4_ = pos;
  pPStack_28 = this;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  local_1d8 = this_local;
  sStack_1d0 = str_local._M_len;
  str_00._M_str = (char *)annotations;
  str_00._M_len = str_local._M_len;
  bVar1 = String::convertWTF8ToWTF16(local_1b0,(ostream *)this_local,str_00);
  pos_00 = annotations_local._4_4_;
  if (bVar1) {
    std::__cxx11::stringstream::str();
    wasm::Name::Name((Name *)&local_268,&local_288);
    IRBuilder::makeStringConst(&local_258,&this->irBuilder,(Name)local_268);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos_00,&local_258);
    Result<wasm::Ok>::~Result(&local_258);
    std::__cxx11::string::~string((string *)&local_288);
  }
  else {
    pos_01 = (ulong)annotations_local._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"invalid string constant",&local_229);
    Lexer::err(&local_208,&this->in,pos_01,&local_228);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_208);
    wasm::Err::~Err(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
  }
  local_230 = 1;
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStringConst(Index pos,
                           const std::vector<Annotation>& annotations,
                           std::string_view str) {
    // Re-encode from WTF-8 to WTF-16.
    std::stringstream wtf16;
    if (!String::convertWTF8ToWTF16(wtf16, str)) {
      return in.err(pos, "invalid string constant");
    }
    // TODO: Use wtf16.view() once we have C++20.
    return withLoc(pos, irBuilder.makeStringConst(wtf16.str()));
  }